

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O0

ON_SubDEdgePtr
ON_SubDQuadFaceTopology_SubdivideEdge
          (ON_SubD_FixedSizeHeap *fsh,bool bUseFindOrAllocate,ON_SubDVertex *qv1,ON_SubDVertex *qv0,
          ON_SubDEdge *e0)

{
  bool bVar1;
  ON_SubDVertex *v1_00;
  ON_SubDEdge *e1_00;
  ON_SubDEdge *e1;
  ON_SubDEdgePtr ep1;
  double v1_weight;
  double v0_weight;
  ON_SubDVertex *v1;
  ON_SubDEdge *e0_local;
  ON_SubDVertex *qv0_local;
  ON_SubDVertex *qv1_local;
  bool bUseFindOrAllocate_local;
  ON_SubD_FixedSizeHeap *fsh_local;
  
  if ((qv1 == (ON_SubDVertex *)0x0) || (e0 == (ON_SubDEdge *)0x0)) {
    ON_SubDIncrementErrorCount();
    fsh_local = (ON_SubD_FixedSizeHeap *)0;
  }
  else {
    v1_00 = ON_SubD_FixedSizeHeap::AllocateEdgeSubdivisionVertex(fsh,bUseFindOrAllocate,e0);
    if (v1_00 == (ON_SubDVertex *)0x0) {
      ON_SubDIncrementErrorCount();
      fsh_local = (ON_SubD_FixedSizeHeap *)0;
    }
    else {
      bVar1 = ON_SubDEdge::IsSmooth(e0);
      if ((bVar1) && (qv0 != (ON_SubDVertex *)0x0)) {
        if (qv1->m_vertex_tag != qv0->m_vertex_tag) {
          ON_SubDIncrementErrorCount();
          return (ON_SubDEdgePtr)0;
        }
        if (qv0->m_vertex_tag == Smooth) {
          v1_weight = 0.0;
        }
        else {
          v1_weight = ON_SubDSectorType::CopyEdgeSectorCoefficient(e0,qv0,-1.23432101234321e+308);
          bVar1 = ON_SubDSectorType::IsValidSectorCoefficientValue(v1_weight,false);
          if (!bVar1) {
            ON_SubDIncrementErrorCount();
            return (ON_SubDEdgePtr)0;
          }
        }
      }
      else {
        v1_weight = 0.0;
      }
      ep1.m_ptr = (ON__UINT_PTR)0.0;
      e1 = (ON_SubDEdge *)
           ON_SubD_FixedSizeHeap::AllocateEdge(fsh,bUseFindOrAllocate,qv1,v1_weight,v1_00,0.0);
      e1_00 = ON_SubDEdgePtr::Edge((ON_SubDEdgePtr *)&e1);
      if (e1_00 == (ON_SubDEdge *)0x0) {
        ON_SubDIncrementErrorCount();
        fsh_local = (ON_SubD_FixedSizeHeap *)0;
      }
      else if ((e1_00->m_edge_tag == e0->m_edge_tag) ||
              ((e1_00->m_edge_tag == Smooth && (e0->m_edge_tag == SmoothX)))) {
        ON_SubDQuadFaceTopology_SetSubdividedEdgeSharpness(e0,qv0,e1_00,qv1);
        fsh_local = (ON_SubD_FixedSizeHeap *)e1;
      }
      else {
        ON_SubDIncrementErrorCount();
        fsh_local = (ON_SubD_FixedSizeHeap *)0;
      }
    }
  }
  return (ON_SubDEdgePtr)(ON__UINT_PTR)fsh_local;
}

Assistant:

static const ON_SubDEdgePtr ON_SubDQuadFaceTopology_SubdivideEdge(
  ON_SubD_FixedSizeHeap& fsh,
  bool bUseFindOrAllocate,
  ON_SubDVertex* qv1,
  const ON_SubDVertex* qv0,
  const ON_SubDEdge* e0
  )
{
  if (nullptr == qv1 || nullptr == e0)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);

  ON_SubDVertex* v1 = fsh.AllocateEdgeSubdivisionVertex(bUseFindOrAllocate,e0);
  if (nullptr == v1)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);

  double v0_weight;
  if ( e0->IsSmooth() && nullptr != qv0)
  {
    // qv1 is the subdivision point of qv0.
    if ( qv1->m_vertex_tag != qv0->m_vertex_tag )
      return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
    if ( ON_SubDVertexTag::Smooth == qv0->m_vertex_tag)
      v0_weight = ON_SubDSectorType::IgnoredSectorCoefficient;
    else
    {
      v0_weight = ON_SubDSectorType::CopyEdgeSectorCoefficient(e0, qv0, ON_UNSET_VALUE);
      if (false == ON_SubDSectorType::IsValidSectorCoefficientValue(v0_weight,false))
        return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
    }
  }
  else
    v0_weight = ON_SubDSectorType::IgnoredSectorCoefficient;

  const double v1_weight = ON_SubDSectorType::IgnoredSectorCoefficient;

  ON_SubDEdgePtr ep1 = fsh.AllocateEdge(bUseFindOrAllocate,qv1,v0_weight,v1,v1_weight);
  ON_SubDEdge* e1 = ep1.Edge();
  if (nullptr == e1)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  if (e1->m_edge_tag != e0->m_edge_tag)
  {
    // On the first subdivision step,
    // e0 with tag ON_SubDEdgeTag::SmoothX turns into 
    // e1 with tag ON_SubDEdgeTag::Smooth.
    if ( ON_SubDEdgeTag::Smooth != e1->m_edge_tag || ON_SubDEdgeTag::SmoothX != e0->m_edge_tag)
      return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  }
  ON_SubDQuadFaceTopology_SetSubdividedEdgeSharpness(e0, qv0, e1, qv1);

  return ep1;
}